

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O1

void installResources_cold_1(void)

{
  fwrite("Too many entities defined\n",0x1a,1,_stderr);
  return;
}

Assistant:

static int addEntity(char *name, char *content) {
    if (nb_entities >= MAX_ENTITIES) {
	fprintf(stderr, "Too many entities defined\n");
	return(-1);
    }
    testEntitiesName[nb_entities] = name;
    testEntitiesValue[nb_entities] = content;
    nb_entities++;
    return(0);
}